

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.c
# Opt level: O3

target_ulong helper_udiv_sparc64(CPUSPARCState_conflict1 *env,target_ulong a,target_ulong b)

{
  target_ulong tVar1;
  uintptr_t unaff_retaddr;
  
  if ((b & 0xffffffff) != 0) {
    tVar1 = (env->y << 0x20 | a & 0xffffffff) / (b & 0xffffffff);
    if (0xfffffffe < tVar1) {
      tVar1 = 0xffffffff;
    }
    return tVar1;
  }
  cpu_raise_exception_ra_sparc64(env,0x28,unaff_retaddr);
}

Assistant:

target_ulong helper_udiv(CPUSPARCState *env, target_ulong a, target_ulong b)
{
    return do_udiv(env, a, b, 0, GETPC());
}